

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O2

void __thiscall embree::Points::updateBuffer(Points *this,RTCBufferType type,uint slot)

{
  uint *puVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  undefined8 *puVar3;
  allocator local_39;
  string local_38 [32];
  
  if (type == RTC_BUFFER_TYPE_NORMAL) {
    if ((this->normals).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (BufferView<embree::Vec3fx> *)((this->normals).items + slot);
  }
  else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (BufferView<embree::Vec3fx> *)((this->vertexAttribs).items + slot);
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"unknown buffer type",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar3 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar3 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar3 + 2),local_38);
      __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pBVar2 = (this->vertices).items + slot;
  }
  puVar1 = &(pBVar2->super_RawBufferView).modCounter;
  *puVar1 = *puVar1 + 1;
  (pBVar2->super_RawBufferView).modified = true;
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void Points::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type == RTC_BUFFER_TYPE_VERTEX) {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    } else if (type == RTC_BUFFER_TYPE_NORMAL) {
      if (slot >= normals.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      normals[slot].setModified();
    } else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    } else {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }